

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymt.cpp
# Opt level: O1

void ymt::SetAttribute(YMTAttributes attribute,string *value)

{
  int iVar1;
  
  switch(attribute) {
  case CONFIG_FILENAME:
    std::__cxx11::string::_M_assign((string *)&config__abi_cxx11_);
    return;
  case LOG_INPUT_FILENAME:
    std::__cxx11::string::_M_assign((string *)&input_log__abi_cxx11_);
    return;
  case EXTRA_PARAM:
    std::__cxx11::string::_M_assign((string *)&extra_param__abi_cxx11_);
    return;
  case PORT:
    std::__cxx11::string::_M_assign((string *)&port__abi_cxx11_);
    return;
  case SERVER_ADDR:
    std::__cxx11::string::_M_assign((string *)&server_addr__abi_cxx11_);
    return;
  case PROFILE_NAME:
    std::__cxx11::string::_M_assign((string *)&profile_name__abi_cxx11_);
    return;
  case NEED_DUMP_BEFORE_LOAD:
    iVar1 = std::__cxx11::string::compare((char *)value);
    is_dump_needed_ = iVar1 == 0;
  }
  return;
}

Assistant:

void ymt::SetAttribute(YMTAttributes attribute, string value) {

	//Set Attributes
	switch (attribute) {
	case CONFIG_FILENAME:
		config_ = value;
		break;
	case LOG_INPUT_FILENAME:
		input_log_ = value;
		break;
	case EXTRA_PARAM:
		extra_param_ = value;
		break;
	case PORT:
		port_ = value;
		break;
	case SERVER_ADDR:
		server_addr_ = value;
		break;
	case PROFILE_NAME:
		profile_name_ = value;
		break;
	case NEED_DUMP_BEFORE_LOAD:
		is_dump_needed_ = (value == "true");
		break;
	}
}